

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O0

void set_maxrhs(void)

{
  int local_20;
  int local_1c;
  int max;
  int length;
  Yshort *item_end;
  Yshort *itemp;
  
  local_1c = 0;
  local_20 = 0;
  for (item_end = ritem; item_end < ritem + nitems; item_end = item_end + 1) {
    if (*item_end < 0) {
      if (local_20 < local_1c) {
        local_20 = local_1c;
      }
      local_1c = 0;
    }
    else {
      local_1c = local_1c + 1;
    }
  }
  maxrhs = local_20;
  return;
}

Assistant:

void set_maxrhs()
{
  register Yshort *itemp;
  register Yshort *item_end;
  register int length;
  register int max;

  length = 0;
  max = 0;
  item_end = ritem + nitems;
  for (itemp = ritem; itemp < item_end; itemp++)
    {
      if (*itemp >= 0)
	{
	  length++;
	}
      else
	{
	  if (length > max) max = length;
	  length = 0;
	}
    }

  maxrhs = max;
}